

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

GridHandle<pbrt::NanoVDBBuffer> *
nanovdb::io::readGrid<pbrt::NanoVDBBuffer>
          (GridHandle<pbrt::NanoVDBBuffer> *__return_storage_ptr__,string *fileName,string *gridName
          ,int verbose,NanoVDBBuffer *buffer)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ifstream is;
  
  std::ifstream::ifstream(&is,(string *)fileName,_S_in|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    readGrid<pbrt::NanoVDBBuffer>(__return_storage_ptr__,(istream *)&is,gridName,buffer);
    if (verbose != 0) {
      iVar2 = (*(__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase[2])
                        (__return_storage_ptr__);
      if (CONCAT44(extraout_var,iVar2) == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"File named \"");
        poVar3 = std::operator<<(poVar3,(string *)fileName);
        std::operator+(&local_270,"\" does not contain a grid named \"",gridName);
        std::operator+(&local_250,&local_270,"\"");
        poVar3 = std::operator<<(poVar3,(string *)&local_250);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_270);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"Read NanoGrid named \"");
        poVar3 = std::operator<<(poVar3,(string *)gridName);
        poVar3 = std::operator<<(poVar3,"\" from the file named \"");
        poVar3 = std::operator<<(poVar3,(string *)fileName);
        poVar3 = std::operator<<(poVar3,"\"");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
    }
    std::ifstream::~ifstream(&is);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_270,"Unable to open file named \"",fileName);
  std::operator+(&local_250,&local_270,"\" for input");
  std::runtime_error::runtime_error(this,(string *)&local_250);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

GridHandle<BufferT> readGrid(const std::string& fileName, const std::string& gridName, int verbose, const BufferT& buffer)
{
    std::ifstream is(fileName, std::ios::in | std::ios::binary);
    if (!is.is_open())
        throw std::runtime_error("Unable to open file named \"" + fileName + "\" for input");
    auto handle = readGrid<BufferT>(is, gridName, buffer);
    if (verbose) {
        if (handle) {
            std::cout << "Read NanoGrid named \"" << gridName << "\" from the file named \"" << fileName << "\"" << std::endl;
        } else {
            std::cout << "File named \"" << fileName << "\" does not contain a grid named \"" + gridName + "\"" << std::endl;
        }
    }
    return handle;// is converted to r-value and return value is move constructed.
}